

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-util.c
# Opt level: O0

my_rational my_rational_product(my_rational *a,my_rational *b)

{
  _Bool _Var1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint a_00;
  wchar_t wVar5;
  size_t sVar6;
  size_t sVar7;
  uint local_9c;
  uint t;
  uint uStack_84;
  _Bool over;
  uint rd;
  uint rn;
  uint16_t w_u16n [5];
  uint16_t sr_u16n [6];
  uint16_t r_u16n [6];
  uint16_t q_u16n [2];
  uint16_t d_u16n [4];
  uint16_t n_u16n [4];
  uint16_t b_u16n [2];
  uint16_t a_u16n [2];
  my_rational result;
  uint bdr;
  uint bnr;
  uint adr;
  uint anr;
  uint g2;
  uint g1;
  my_rational *b_local;
  my_rational *a_local;
  
  uVar2 = gcd(a->n,b->d);
  uVar3 = gcd(a->d,b->n);
  uVar4 = a->n / uVar2;
  a_00 = a->d / uVar3;
  uVar3 = b->n / uVar3;
  uVar2 = b->d / uVar2;
  if (((uVar3 == 0) || (uVar4 <= (uint)(0xffffffff / (ulong)uVar3))) &&
     (a_00 <= (uint)(0xffffffff / (ulong)uVar2))) {
    a_local = (my_rational *)CONCAT44(a_00 * uVar2,uVar4 * uVar3);
  }
  else {
    _Var1 = ini_u16n(n_u16n + 2,2,uVar4);
    if (_Var1) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/z-util.c"
                    ,0x736,
                    "struct my_rational my_rational_product(const struct my_rational *, const struct my_rational *)"
                   );
    }
    _Var1 = ini_u16n(n_u16n,2,uVar3);
    if (_Var1) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/z-util.c"
                    ,0x73a,
                    "struct my_rational my_rational_product(const struct my_rational *, const struct my_rational *)"
                   );
    }
    _Var1 = mul_u16n(d_u16n,n_u16n + 2,n_u16n,4,2,2);
    if (_Var1) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/z-util.c"
                    ,0x73f,
                    "struct my_rational my_rational_product(const struct my_rational *, const struct my_rational *)"
                   );
    }
    _Var1 = ini_u16n(n_u16n + 2,2,a_00);
    if (_Var1) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/z-util.c"
                    ,0x743,
                    "struct my_rational my_rational_product(const struct my_rational *, const struct my_rational *)"
                   );
    }
    _Var1 = ini_u16n(n_u16n,2,uVar2);
    if (_Var1) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/z-util.c"
                    ,0x747,
                    "struct my_rational my_rational_product(const struct my_rational *, const struct my_rational *)"
                   );
    }
    _Var1 = mul_u16n(r_u16n + 4,n_u16n + 2,n_u16n,4,2,2);
    if (_Var1) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/z-util.c"
                    ,0x74c,
                    "struct my_rational my_rational_product(const struct my_rational *, const struct my_rational *)"
                   );
    }
    wVar5 = div_u16n(r_u16n + 2,sr_u16n + 2,(uint16_t *)((long)&rd + 2),d_u16n,r_u16n + 4,2,4,4);
    if ((wVar5 == L'\0') && (sVar6 = msb_u16n(r_u16n + 2,2), sVar6 < 0x21)) {
      uVar4 = ext_u16n(r_u16n + 2,2);
      if (uVar4 == 0xffffffff) {
        local_9c = 1;
      }
      else {
        local_9c = (uint)(0xffffffff / (ulong)(uVar4 + 1));
      }
      t = local_9c;
      _Var1 = ini_u16n(n_u16n + 2,2,local_9c);
      if (_Var1) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/z-util.c"
                      ,0x75d,
                      "struct my_rational my_rational_product(const struct my_rational *, const struct my_rational *)"
                     );
      }
      _Var1 = mul_u16n(w_u16n + 1,sr_u16n + 2,n_u16n + 2,6,4,2);
      if (_Var1) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/z-util.c"
                      ,0x762,
                      "struct my_rational my_rational_product(const struct my_rational *, const struct my_rational *)"
                     );
      }
      wVar5 = div_u16n(r_u16n + 2,sr_u16n + 2,(uint16_t *)((long)&rd + 2),w_u16n + 1,r_u16n + 4,2,6,
                       4);
      if (wVar5 != L'\0') {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/z-util.c"
                      ,0x767,
                      "struct my_rational my_rational_product(const struct my_rational *, const struct my_rational *)"
                     );
      }
      sVar6 = msb_u16n(r_u16n + 2,2);
      if (0x20 < sVar6) {
        __assert_fail("msb_u16n(q_u16n, MP_DIGITS) <= sizeof(unsigned int) * CHAR_BIT",
                      "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/z-util.c"
                      ,0x76a,
                      "struct my_rational my_rational_product(const struct my_rational *, const struct my_rational *)"
                     );
      }
      uStack_84 = ext_u16n(r_u16n + 2,2);
      if (-uStack_84 - 1 < local_9c * uVar4) {
        __assert_fail("rn <= UINT_MAX - t",
                      "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/z-util.c"
                      ,0x76c,
                      "struct my_rational my_rational_product(const struct my_rational *, const struct my_rational *)"
                     );
      }
      uStack_84 = uStack_84 + local_9c * uVar4;
      sVar6 = msb_u16n(sr_u16n + 2,6);
      sVar7 = msb_u16n(r_u16n + 4,4);
      if (sVar7 <= sVar6 + 1) {
        if (uStack_84 == 0xffffffff) {
          __assert_fail("rn < UINT_MAX",
                        "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/z-util.c"
                        ,0x771,
                        "struct my_rational my_rational_product(const struct my_rational *, const struct my_rational *)"
                       );
        }
        uStack_84 = uStack_84 + 1;
      }
    }
    else {
      uStack_84 = 0xffffffff;
      t = 1;
    }
    a_local = (my_rational *)my_rational_construct(uStack_84,t);
  }
  return (my_rational)a_local;
}

Assistant:

struct my_rational my_rational_product(const struct my_rational *a,
		const struct my_rational *b)
{
	unsigned int g1 = gcd(a->n, b->d);
	unsigned int g2 = gcd(a->d, b->n);
	unsigned int anr = a->n / g1;
	unsigned int adr = a->d / g2;
	unsigned int bnr = b->n / g2;
	unsigned int bdr = b->d / g1;
	struct my_rational result;

	if ((bnr && anr > UINT_MAX / bnr) || (adr > UINT_MAX / bdr)) {
		/* Overflows in native arithmetic so approximate. */
#define MP_DIGITS ((sizeof(unsigned int) + (sizeof(uint16_t) - 1)) / sizeof(uint16_t))
		uint16_t a_u16n[MP_DIGITS], b_u16n[MP_DIGITS];
		uint16_t n_u16n[2 * MP_DIGITS], d_u16n[2 * MP_DIGITS];
		uint16_t q_u16n[MP_DIGITS], r_u16n[3 * MP_DIGITS];
		uint16_t sr_u16n[3 * MP_DIGITS], w_u16n[2 * MP_DIGITS + 1];
		unsigned int rn, rd;
		bool over;

		over = ini_u16n(a_u16n, MP_DIGITS, anr);
		if (over) {
			assert(0);
		}
		over = ini_u16n(b_u16n, MP_DIGITS, bnr);
		if (over) {
			assert(0);
		}
		over = mul_u16n(n_u16n, a_u16n, b_u16n, 2 * MP_DIGITS,
			MP_DIGITS, MP_DIGITS);
		if (over) {
			assert(0);
		}
		over = ini_u16n(a_u16n, MP_DIGITS, adr);
		if (over) {
			assert(0);
		}
		over = ini_u16n(b_u16n, MP_DIGITS, bdr);
		if (over) {
			assert(0);
		}
		over = mul_u16n(d_u16n, a_u16n, b_u16n, 2 * MP_DIGITS,
			MP_DIGITS, MP_DIGITS);
		if (over) {
			assert(0);
		}
		over = (div_u16n(q_u16n, r_u16n, w_u16n, n_u16n, d_u16n,
			MP_DIGITS, 2 * MP_DIGITS, 2 * MP_DIGITS) != 0);
		if (!over && msb_u16n(q_u16n, MP_DIGITS)
				<= sizeof(unsigned int) * CHAR_BIT) {
			unsigned int t;

			rn = ext_u16n(q_u16n, MP_DIGITS);
			/*
			 * Use as large as possible of a denominator so the
			 * approximation is as accurate as possible.
			 */
			rd = (rn < UINT_MAX) ? UINT_MAX / (rn + 1) : 1;
			rn *= rd;
			over = ini_u16n(a_u16n, MP_DIGITS, rd);
			if (over) {
				assert(0);
			}
			over = mul_u16n(sr_u16n, r_u16n, a_u16n, 3 * MP_DIGITS,
				2 * MP_DIGITS, MP_DIGITS);
			if (over) {
				assert(0);
			}
			over = div_u16n(q_u16n, r_u16n, w_u16n, sr_u16n, d_u16n,
				MP_DIGITS, 3 * MP_DIGITS, 2 * MP_DIGITS);
			if (over) {
				assert(0);
			}
			assert(msb_u16n(q_u16n, MP_DIGITS)
				<= sizeof(unsigned int) * CHAR_BIT);
			t = ext_u16n(q_u16n, MP_DIGITS);
			assert(rn <= UINT_MAX - t);
			rn += t;
			/* Approximate rounding to the nearest. */
			if (msb_u16n(r_u16n, 3 * MP_DIGITS) + 1
					>= msb_u16n(d_u16n, 2 * MP_DIGITS)) {
				assert(rn < UINT_MAX);
				++rn;
			}
		} else {
			rn = UINT_MAX;
			rd = 1;
		}
		return my_rational_construct(rn, rd);
#undef MP_DIGITS
	}
	result.n = anr * bnr;
	result.d = adr * bdr;
	return result;
}